

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

vm_val_t * __thiscall StackArgs::get(StackArgs *this,vm_val_t *val)

{
  vm_val_t *pvVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  
  if (this->lastarg < this->curarg) {
    val->typ = VM_NIL;
    return val;
  }
  pvVar1 = sp_ + (-1 - (long)this->curarg);
  uVar3 = *(undefined4 *)&pvVar1->field_0x4;
  aVar2 = pvVar1->val;
  val->typ = pvVar1->typ;
  *(undefined4 *)&val->field_0x4 = uVar3;
  val->val = aVar2;
  return val;
}

Assistant:

virtual vm_val_t *get(vm_val_t *val)
    {
        if (curarg <= lastarg)
            *val = *stk->get(curarg);
        else
            val->set_nil();
        return val;
    }